

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::NetParameter::InternalSerializeWithCachedSizesToArray
          (NetParameter *this,bool deterministic,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int size;
  uint uVar4;
  char *pcVar5;
  string *psVar6;
  V1LayerParameter *value;
  BlobShape *value_00;
  LayerParameter *value_01;
  UnknownFieldSet *unknown_fields;
  uint local_60;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  int n_1;
  int i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  NetParameter *this_local;
  
  uVar4 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar4 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.NetParameter.name");
    psVar6 = name_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(1,psVar6,target);
  }
  i_1 = 0;
  uVar3 = layers_size(this);
  for (; (uint)i_1 < uVar3; i_1 = i_1 + 1) {
    value = layers(this,i_1);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::V1LayerParameter>(2,value,deterministic,_i);
  }
  i_2 = 0;
  iVar2 = input_size(this);
  for (; (int)i_2 < iVar2; i_2 = i_2 + 1) {
    input_abi_cxx11_(this,i_2);
    pcVar5 = (char *)std::__cxx11::string::data();
    input_abi_cxx11_(this,i_2);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,size,SERIALIZE,"caffe.NetParameter.input");
    psVar6 = input_abi_cxx11_(this,i_2);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,psVar6,_i);
  }
  _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4,&this->input_dim_,_i);
  if ((uVar4 & 4) != 0) {
    bVar1 = force_backward(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(5,bVar1,_i);
  }
  if ((uVar4 & 2) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::NetState>(6,this->state_,deterministic,_i);
  }
  if ((uVar4 & 8) != 0) {
    bVar1 = debug_info(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(7,bVar1,_i);
  }
  i_3 = 0;
  uVar4 = input_shape_size(this);
  for (; i_3 < uVar4; i_3 = i_3 + 1) {
    value_00 = input_shape(this,i_3);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::BlobShape>(8,value_00,deterministic,_i);
  }
  local_60 = 0;
  uVar4 = layer_size(this);
  for (; local_60 < uVar4; local_60 = local_60 + 1) {
    value_01 = layer(this,local_60);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::LayerParameter>(100,value_01,deterministic,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* NetParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .caffe.V1LayerParameter layers = 2;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->layers(i), deterministic, target);
  }

  // repeated string input = 3;
  for (int i = 0, n = this->input_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->input(i).data(), this->input(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetParameter.input");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->input(i), target);
  }

  // repeated int32 input_dim = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(4, this->input_dim_, target);

  // optional bool force_backward = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->force_backward(), target);
  }

  // optional .caffe.NetState state = 6;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, *this->state_, deterministic, target);
  }

  // optional bool debug_info = 7 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->debug_info(), target);
  }

  // repeated .caffe.BlobShape input_shape = 8;
  for (unsigned int i = 0, n = this->input_shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->input_shape(i), deterministic, target);
  }

  // repeated .caffe.LayerParameter layer = 100;
  for (unsigned int i = 0, n = this->layer_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        100, this->layer(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetParameter)
  return target;
}